

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::PoolingParameter::Clear(PoolingParameter *this)

{
  PoolingParameter *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 0xff) != 0) {
    memset(&this->pool_,0,0x20);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xf00) != 0) {
    memset(&this->pad_w_,0,9);
    this->stride_ = 1;
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void PoolingParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.PoolingParameter)
  if (_has_bits_[0 / 32] & 255u) {
    ::memset(&pool_, 0, reinterpret_cast<char*>(&pad_h_) -
      reinterpret_cast<char*>(&pool_) + sizeof(pad_h_));
  }
  if (_has_bits_[8 / 32] & 3840u) {
    ::memset(&pad_w_, 0, reinterpret_cast<char*>(&global_pooling_) -
      reinterpret_cast<char*>(&pad_w_) + sizeof(global_pooling_));
    stride_ = 1u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}